

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_MLMG.cpp
# Opt level: O3

void __thiscall amrex::MLMG::interpCorrection(MLMG *this,int alev)

{
  pointer pVVar1;
  uint uVar2;
  pointer *__ptr;
  MLLinOp *pMVar3;
  long *local_88;
  undefined8 local_7c;
  int local_74;
  undefined8 local_70;
  Geometry *local_68;
  undefined8 local_60;
  uint local_54;
  uint local_50;
  uint local_4c;
  IntVect local_48;
  uint local_3c;
  uint local_38;
  uint local_34;
  
  local_7c = 0;
  local_74 = 0;
  if (this->cf_strategy == ghostnodes) {
    local_74 = (*this->linop->_vptr_MLLinOp[6])(this->linop,alev,0);
    local_7c = CONCAT44(local_74,local_74);
  }
  pMVar3 = this->linop;
  pVVar1 = (this->cor).
           super_vector<amrex::Vector<amrex::Any,_std::allocator<amrex::Any>_>,_std::allocator<amrex::Vector<amrex::Any,_std::allocator<amrex::Any>_>_>_>
           .
           super__Vector_base<amrex::Vector<amrex::Any,_std::allocator<amrex::Any>_>,_std::allocator<amrex::Vector<amrex::Any,_std::allocator<amrex::Any>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  uVar2 = 0;
  local_3c = 0;
  if ((pMVar3->m_ixtype).vect[1] == 0 && (pMVar3->m_ixtype).vect[0] == 0) {
    local_3c = (uint)((pMVar3->m_ixtype).vect[2] == 0);
  }
  local_60 = *(undefined8 *)
              &pVVar1[(long)alev + -1].super_vector<amrex::Any,_std::allocator<amrex::Any>_>;
  local_70 = *(undefined8 *)
              &pVVar1[alev].super_vector<amrex::Any,_std::allocator<amrex::Any>_>.
               super__Vector_base<amrex::Any,_std::allocator<amrex::Any>_>;
  local_68 = *(Geometry **)
              &(pMVar3->m_geom).
               super_vector<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>,_std::allocator<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>_>_>
               .
               super__Vector_base<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>,_std::allocator<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start[(long)alev + -1].
               super_vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>;
  if (this->cf_strategy == ghostnodes) {
    uVar2 = (*pMVar3->_vptr_MLLinOp[6])(pMVar3,(ulong)(alev - 1U),0);
    local_3c = (*this->linop->_vptr_MLLinOp[6])(this->linop,(ulong)(alev - 1U),0);
    pMVar3 = this->linop;
  }
  local_54 = local_3c;
  local_50 = local_3c;
  local_4c = local_3c;
  (*pMVar3->_vptr_MLLinOp[0x29])(&local_88,pMVar3,alev);
  (*this->linop->_vptr_MLLinOp[0x2e])(this->linop,&local_88);
  pMVar3 = this->linop;
  local_54 = uVar2;
  local_50 = uVar2;
  local_4c = uVar2;
  local_38 = local_3c;
  local_34 = local_3c;
  local_48.vect = (int  [3])Geometry::periodicity(local_68);
  (*pMVar3->_vptr_MLLinOp[0x31])(pMVar3,&local_88,local_60,&local_54,&local_3c);
  (*this->linop->_vptr_MLLinOp[0x3d])(this->linop,alev,local_70,&local_88,&local_7c);
  if (local_88 != (long *)0x0) {
    (**(code **)(*local_88 + 0x10))();
  }
  return;
}

Assistant:

void
MLMG::interpCorrection (int alev)
{
    BL_PROFILE("MLMG::interpCorrection_1");

    IntVect nghost(0);
    if (cf_strategy == CFStrategy::ghostnodes) nghost = IntVect(linop.getNGrow(alev));

    Any const& crse_cor = cor[alev-1][0];
    Any      & fine_cor = cor[alev  ][0];

    const Geometry& crse_geom = linop.Geom(alev-1,0);

    int ng_src = 0;
    int ng_dst = linop.isCellCentered() ? 1 : 0;
    if (cf_strategy == CFStrategy::ghostnodes)
    {
        ng_src = linop.getNGrow(alev-1);
        ng_dst = linop.getNGrow(alev-1);
    }

    Any cfine = linop.AnyMakeCoarseAmr(alev, IntVect(ng_dst));
    linop.AnySetToZero(cfine);
    linop.AnyParallelCopy(cfine, crse_cor, IntVect(ng_src), IntVect(ng_dst), crse_geom.periodicity());

    linop.AnyInterpolationAmr(alev, fine_cor, cfine, nghost);
}